

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

char * execute_abi_cxx11_(char *cmd)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  char *in_RSI;
  allocator local_aa;
  undefined1 local_a9;
  char local_a8 [8];
  char buffer [128];
  FILE *pipe;
  char *cmd_local;
  string *result;
  
  __stream = popen(in_RSI,"r");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    error(1,*piVar2,"Pipe error");
  }
  local_a9 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)cmd,"",&local_aa);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa);
  while (iVar1 = feof(__stream), iVar1 == 0) {
    pcVar3 = fgets(local_a8,0x80,__stream);
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)cmd,local_a8);
    }
  }
  pclose(__stream);
  return cmd;
}

Assistant:

std::string execute(const char* cmd)
{
    FILE* pipe = popen(cmd, "r");
    if (!pipe)
        error(EXIT_FAILURE, errno, "Pipe error");
    char buffer[128];
    std::string result = "";
    while(!feof(pipe))
        if(fgets(buffer, 128, pipe) != NULL)
            result += buffer;
    pclose(pipe);
    return result;
}